

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuTexLookupVerifier.cpp
# Opt level: O0

bool tcu::isGatherOffsetsResultValid<tcu::IntLookupPrecision,unsigned_int>
               (ConstPixelBufferAccess *level,Sampler *sampler,IntLookupPrecision *prec,Vec2 *coord,
               int coordZ,int componentNdx,IVec2 (*offsets) [4],Vector<unsigned_int,_4> *result)

{
  WrapMode WVar1;
  bool bVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  uint uVar6;
  deInt32 dVar7;
  uint uVar8;
  deInt32 dVar9;
  uint *puVar10;
  float fVar11;
  Vector<unsigned_int,_4> local_94;
  int local_84;
  int local_80;
  int y;
  int x;
  int offNdx;
  Vector<unsigned_int,_4> color;
  int i;
  int j;
  int h;
  int w;
  int maxJ;
  int minJ;
  int maxI;
  int minI;
  Vec2 vBounds;
  Vec2 uBounds;
  int componentNdx_local;
  int coordZ_local;
  Vec2 *coord_local;
  IntLookupPrecision *prec_local;
  Sampler *sampler_local;
  ConstPixelBufferAccess *level_local;
  
  bVar2 = sampler->normalizedCoords;
  iVar3 = ConstPixelBufferAccess::getWidth(level);
  fVar11 = Vector<float,_2>::x(coord);
  iVar4 = Vector<int,_3>::x((Vector<int,_3> *)prec);
  iVar5 = Vector<int,_3>::x((Vector<int,_3> *)(prec + 0xc));
  TexVerifierUtil::computeNonNormalizedCoordBounds
            ((TexVerifierUtil *)&vBounds,(bool)(bVar2 & 1),iVar3,fVar11,iVar4,iVar5);
  bVar2 = sampler->normalizedCoords;
  iVar3 = ConstPixelBufferAccess::getHeight(level);
  fVar11 = Vector<float,_2>::y(coord);
  iVar4 = Vector<int,_3>::y((Vector<int,_3> *)prec);
  iVar5 = Vector<int,_3>::y((Vector<int,_3> *)(prec + 0xc));
  TexVerifierUtil::computeNonNormalizedCoordBounds
            ((TexVerifierUtil *)&maxI,(bool)(bVar2 & 1),iVar3,fVar11,iVar4,iVar5);
  fVar11 = Vector<float,_2>::x(&vBounds);
  uVar6 = deFloorFloatToInt32(fVar11 - 0.5);
  fVar11 = Vector<float,_2>::y(&vBounds);
  dVar7 = deFloorFloatToInt32(fVar11 - 0.5);
  fVar11 = Vector<float,_2>::x((Vector<float,_2> *)&maxI);
  uVar8 = deFloorFloatToInt32(fVar11 - 0.5);
  fVar11 = Vector<float,_2>::y((Vector<float,_2> *)&maxI);
  dVar9 = deFloorFloatToInt32(fVar11 - 0.5);
  iVar3 = ConstPixelBufferAccess::getWidth(level);
  iVar4 = ConstPixelBufferAccess::getHeight(level);
  color.m_data[3] = uVar8;
  do {
    color.m_data[2] = uVar6;
    if (dVar9 < (int)color.m_data[3]) {
      return false;
    }
    for (; (int)color.m_data[2] <= dVar7; color.m_data[2] = color.m_data[2] + 1) {
      Vector<unsigned_int,_4>::Vector((Vector<unsigned_int,_4> *)&x);
      for (y = 0; uVar8 = color.m_data[2], y < 4; y = y + 1) {
        WVar1 = sampler->wrapS;
        iVar5 = Vector<int,_2>::x(*offsets + y);
        local_80 = TexVerifierUtil::wrap(WVar1,uVar8 + iVar5,iVar3);
        uVar8 = color.m_data[3];
        WVar1 = sampler->wrapT;
        iVar5 = Vector<int,_2>::y(*offsets + y);
        local_84 = TexVerifierUtil::wrap(WVar1,uVar8 + iVar5,iVar4);
        lookup<unsigned_int>((tcu *)&local_94,level,sampler,local_80,local_84,coordZ);
        puVar10 = Vector<unsigned_int,_4>::operator[](&local_94,componentNdx);
        uVar8 = *puVar10;
        puVar10 = Vector<unsigned_int,_4>::operator[]((Vector<unsigned_int,_4> *)&x,y);
        *puVar10 = uVar8;
      }
      bVar2 = isColorValid(prec,(UVec4 *)&x,result);
      if (bVar2) {
        return true;
      }
    }
    color.m_data[3] = color.m_data[3] + 1;
  } while( true );
}

Assistant:

static bool isGatherOffsetsResultValid (const ConstPixelBufferAccess&	level,
										const Sampler&					sampler,
										const PrecType&					prec,
										const Vec2&						coord,
										int								coordZ,
										int								componentNdx,
										const IVec2						(&offsets)[4],
										const Vector<ScalarType, 4>&	result)
{
	const Vec2	uBounds		= computeNonNormalizedCoordBounds(sampler.normalizedCoords, level.getWidth(), coord.x(), prec.coordBits.x(), prec.uvwBits.x());
	const Vec2	vBounds		= computeNonNormalizedCoordBounds(sampler.normalizedCoords, level.getHeight(), coord.y(), prec.coordBits.y(), prec.uvwBits.y());

	// Integer coordinate bounds for (x0, y0) - without wrap mode
	const int	minI		= deFloorFloatToInt32(uBounds.x()-0.5f);
	const int	maxI		= deFloorFloatToInt32(uBounds.y()-0.5f);
	const int	minJ		= deFloorFloatToInt32(vBounds.x()-0.5f);
	const int	maxJ		= deFloorFloatToInt32(vBounds.y()-0.5f);

	const int	w			= level.getWidth();
	const int	h			= level.getHeight();

	for (int j = minJ; j <= maxJ; j++)
	{
		for (int i = minI; i <= maxI; i++)
		{
			Vector<ScalarType, 4> color;
			for (int offNdx = 0; offNdx < 4; offNdx++)
			{
				// offNdx-th coordinate offset and then wrapped.
				const int x = wrap(sampler.wrapS, i+offsets[offNdx].x(), w);
				const int y = wrap(sampler.wrapT, j+offsets[offNdx].y(), h);
				color[offNdx] = lookup<ScalarType>(level, sampler, x, y, coordZ)[componentNdx];
			}

			if (isColorValid(prec, color, result))
				return true;
		}
	}

	return false;
}